

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O2

int poll(pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  
  iVar1._0_2_ = __fds[4].events;
  iVar1._2_2_ = __fds[4].revents;
  return -(uint)(iVar1 != 0) | 0xfffffc16;
}

Assistant:

static MPP_RET poll(Kmpp *ctx, MppPortType type, MppPollType timeout)
{
    MPP_RET ret = MPP_NOK;
    (void)type;
    (void)timeout;

    if (!ctx->mInitDone)
        return MPP_ERR_INIT;

    return ret;
}